

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_global.c
# Opt level: O0

void * sigcatch_new(t_symbol *s)

{
  t_object *owner;
  _binbuf *p_Var1;
  t_sigcatch *x;
  t_symbol *s_local;
  
  owner = (t_object *)pd_new(sigcatch_class);
  pd_bind((t_pd *)owner,s);
  owner[1].te_g.g_pd = (t_pd)s;
  *(undefined4 *)&owner[1].te_g.g_next = 0x40;
  p_Var1 = (_binbuf *)getbytes(0x100);
  owner[1].te_binbuf = p_Var1;
  memset(owner[1].te_binbuf,0,0x100);
  outlet_new(owner,&s_signal);
  return owner;
}

Assistant:

static void *sigcatch_new(t_symbol *s)
{
    t_sigcatch *x = (t_sigcatch *)pd_new(sigcatch_class);
    pd_bind(&x->x_obj.ob_pd, s);
    x->x_sym = s;
    x->x_n = DEFSENDVS;
    x->x_vec = (t_sample *)getbytes(DEFSENDVS * sizeof(t_sample));
    memset((char *)(x->x_vec), 0, DEFSENDVS * sizeof(t_sample));
    outlet_new(&x->x_obj, &s_signal);
    return (x);
}